

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

int uv_run(uv_loop_t *loop,uv_run_mode mode)

{
  int iVar1;
  bool bVar2;
  int local_1c;
  int can_sleep;
  int r;
  int timeout;
  uv_run_mode mode_local;
  uv_loop_t *loop_local;
  
  local_1c = uv__loop_alive(loop);
  if (local_1c == 0) {
    uv__update_time(loop);
  }
  if (((mode == UV_RUN_DEFAULT) && (local_1c != 0)) && (loop->stop_flag == 0)) {
    uv__update_time(loop);
    uv__run_timers(loop);
  }
  while( true ) {
    bVar2 = false;
    if (local_1c != 0) {
      bVar2 = loop->stop_flag == 0;
    }
    if (!bVar2) break;
    iVar1 = uv__queue_empty(&loop->pending_queue);
    bVar2 = false;
    if (iVar1 != 0) {
      iVar1 = uv__queue_empty(&loop->idle_handles);
      bVar2 = iVar1 != 0;
    }
    uv__run_pending(loop);
    uv__run_idle(loop);
    uv__run_prepare(loop);
    can_sleep = 0;
    if (((mode == UV_RUN_ONCE) && (bVar2)) || (mode == UV_RUN_DEFAULT)) {
      can_sleep = uv__backend_timeout(loop);
    }
    *(long *)((long)loop->internal_fields + 8) = *(long *)((long)loop->internal_fields + 8) + 1;
    uv__io_poll(loop,can_sleep);
    local_1c = 0;
    while( true ) {
      bVar2 = false;
      if (local_1c < 8) {
        iVar1 = uv__queue_empty(&loop->pending_queue);
        bVar2 = iVar1 == 0;
      }
      if (!bVar2) break;
      uv__run_pending(loop);
      local_1c = local_1c + 1;
    }
    uv__metrics_update_idle_time(loop);
    uv__run_check(loop);
    uv__run_closing_handles(loop);
    uv__update_time(loop);
    uv__run_timers(loop);
    local_1c = uv__loop_alive(loop);
    if ((mode == UV_RUN_ONCE) || (mode == UV_RUN_NOWAIT)) break;
  }
  if (loop->stop_flag != 0) {
    loop->stop_flag = 0;
  }
  return local_1c;
}

Assistant:

int uv_run(uv_loop_t* loop, uv_run_mode mode) {
  int timeout;
  int r;
  int can_sleep;

  r = uv__loop_alive(loop);
  if (!r)
    uv__update_time(loop);

  /* Maintain backwards compatibility by processing timers before entering the
   * while loop for UV_RUN_DEFAULT. Otherwise timers only need to be executed
   * once, which should be done after polling in order to maintain proper
   * execution order of the conceptual event loop. */
  if (mode == UV_RUN_DEFAULT && r != 0 && loop->stop_flag == 0) {
    uv__update_time(loop);
    uv__run_timers(loop);
  }

  while (r != 0 && loop->stop_flag == 0) {
    can_sleep =
        uv__queue_empty(&loop->pending_queue) &&
        uv__queue_empty(&loop->idle_handles);

    uv__run_pending(loop);
    uv__run_idle(loop);
    uv__run_prepare(loop);

    timeout = 0;
    if ((mode == UV_RUN_ONCE && can_sleep) || mode == UV_RUN_DEFAULT)
      timeout = uv__backend_timeout(loop);

    uv__metrics_inc_loop_count(loop);

    uv__io_poll(loop, timeout);

    /* Process immediate callbacks (e.g. write_cb) a small fixed number of
     * times to avoid loop starvation.*/
    for (r = 0; r < 8 && !uv__queue_empty(&loop->pending_queue); r++)
      uv__run_pending(loop);

    /* Run one final update on the provider_idle_time in case uv__io_poll
     * returned because the timeout expired, but no events were received. This
     * call will be ignored if the provider_entry_time was either never set (if
     * the timeout == 0) or was already updated b/c an event was received.
     */
    uv__metrics_update_idle_time(loop);

    uv__run_check(loop);
    uv__run_closing_handles(loop);

    uv__update_time(loop);
    uv__run_timers(loop);

    r = uv__loop_alive(loop);
    if (mode == UV_RUN_ONCE || mode == UV_RUN_NOWAIT)
      break;
  }

  /* The if statement lets gcc compile it to a conditional store. Avoids
   * dirtying a cache line.
   */
  if (loop->stop_flag != 0)
    loop->stop_flag = 0;

  return r;
}